

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xinclude(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlDocPtr pxVar6;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int *piVar7;
  int n_doc;
  uint uVar8;
  undefined4 uVar9;
  xmlNodePtr in_RSI;
  xmlNodePtr pxVar10;
  int n_flags;
  uint uVar11;
  int n_data;
  uint *puVar12;
  undefined4 *puVar13;
  int test_ret_1;
  int test_ret;
  int test_ret_2;
  int test_ret_3;
  int test_ret_4;
  int local_4c;
  int local_48;
  int local_44;
  undefined4 *local_40;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xinclude : 8 of 10 functions ...");
  }
  uVar8 = 0;
  local_48 = 0;
  do {
    iVar1 = xmlMemBlocks();
    pxVar6 = gen_xmlDocPtr(uVar8,(int)in_RSI);
    xmlXIncludeProcess(pxVar6);
    call_tests = call_tests + 1;
    if (((pxVar6 != (xmlDocPtr)0x0) && (api_doc != pxVar6)) && (pxVar6->doc != api_doc)) {
      xmlFreeDoc(pxVar6);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcess",(ulong)(uint)(iVar2 - iVar1));
      local_48 = local_48 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 4);
  function_tests = function_tests + 1;
  local_4c = 0;
  uVar8 = 0;
  do {
    puVar12 = &DAT_00163454;
    pxVar10 = (xmlNodePtr)0x0;
    do {
      iVar2 = (int)in_RSI;
      iVar1 = xmlMemBlocks();
      pxVar6 = gen_xmlDocPtr(uVar8,iVar2);
      in_RSI = (xmlNodePtr)0xffffffff;
      uVar11 = (uint)pxVar10;
      if (uVar11 < 4) {
        in_RSI = (xmlNodePtr)(ulong)*puVar12;
      }
      xmlXIncludeProcessFlags(pxVar6);
      call_tests = call_tests + 1;
      if (((pxVar6 != (xmlDocPtr)0x0) && (api_doc != pxVar6)) && (pxVar6->doc != api_doc)) {
        xmlFreeDoc(pxVar6);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessFlags",(ulong)(uint)(iVar2 - iVar1));
        local_4c = local_4c + 1;
        printf(" %d",(ulong)uVar8);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      uVar11 = uVar11 + 1;
      pxVar10 = (xmlNodePtr)(ulong)uVar11;
      puVar12 = puVar12 + 1;
    } while (uVar11 != 4);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 4);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar8 = 0;
  do {
    uVar11 = 0;
    do {
      pxVar10 = (xmlNodePtr)0x0;
      do {
        iVar2 = (int)in_RSI;
        iVar1 = xmlMemBlocks();
        pxVar6 = gen_xmlDocPtr(uVar8,iVar2);
        in_RSI = (xmlNodePtr)0xffffffff;
        if (uVar11 < 4) {
          in_RSI = (xmlNodePtr)(ulong)(uint)(&DAT_00163454)[uVar11];
        }
        piVar7 = &call_tests;
        iVar2 = (int)pxVar10;
        if (iVar2 != 0) {
          if (iVar2 == 1) {
            piVar7 = (int *)0xffffffffffffffff;
          }
          else {
            piVar7 = (int *)0x0;
          }
        }
        xmlXIncludeProcessFlagsData(pxVar6,in_RSI,piVar7);
        call_tests = call_tests + 1;
        if (((pxVar6 != (xmlDocPtr)0x0) && (api_doc != pxVar6)) && (pxVar6->doc != api_doc)) {
          xmlFreeDoc(pxVar6);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar1 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessFlagsData",
                 (ulong)(uint)(iVar3 - iVar1));
          local_44 = local_44 + 1;
          printf(" %d",(ulong)uVar8);
          printf(" %d",(ulong)uVar11);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar10;
        }
        pxVar10 = (xmlNodePtr)(ulong)(iVar2 + 1U);
      } while (iVar2 + 1U != 3);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 4);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar1 = 0;
  do {
    iVar3 = (int)in_RSI;
    iVar2 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar8,iVar3);
    xmlXIncludeProcessNode(0,in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar8,in_RSI,nr);
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcessNode",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      printf(" %d",0);
      in_RSI = (xmlNodePtr)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  function_tests = function_tests + 1;
  uVar8 = 0;
  local_34 = 0;
  do {
    iVar3 = (int)in_RSI;
    iVar2 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar8,iVar3);
    xmlXIncludeProcessTree(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar8,in_RSI,nr_00);
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcessTree",(ulong)(uint)(iVar3 - iVar2));
      local_34 = local_34 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  iVar2 = local_4c + local_48 + local_44;
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar8 = 0;
  do {
    puVar13 = &DAT_00163454;
    pxVar10 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(uVar8,iVar4);
      uVar9 = 0xffffffff;
      uVar11 = (uint)pxVar10;
      if (uVar11 < 4) {
        uVar9 = *puVar13;
      }
      xmlXIncludeProcessTreeFlags(in_RSI,uVar9);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar8,in_RSI,nr_01);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlags",(ulong)(uint)(iVar4 - iVar3)
              );
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar8);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      uVar11 = uVar11 + 1;
      pxVar10 = (xmlNodePtr)(ulong)uVar11;
      puVar13 = puVar13 + 1;
    } while (uVar11 != 4);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  function_tests = function_tests + 1;
  local_44 = 0;
  local_40 = &DAT_00163454;
  uVar8 = 0;
  do {
    uVar11 = 0;
    do {
      pxVar10 = (xmlNodePtr)0x0;
      do {
        iVar4 = (int)in_RSI;
        iVar3 = xmlMemBlocks();
        in_RSI = gen_xmlNodePtr(uVar8,iVar4);
        uVar9 = 0xffffffff;
        if (uVar11 < 4) {
          uVar9 = (&DAT_00163454)[uVar11];
        }
        piVar7 = &call_tests;
        iVar4 = (int)pxVar10;
        if (iVar4 != 0) {
          if (iVar4 == 1) {
            piVar7 = (int *)0xffffffffffffffff;
          }
          else {
            piVar7 = (int *)0x0;
          }
        }
        xmlXIncludeProcessTreeFlagsData(in_RSI,uVar9,piVar7);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar8,in_RSI,nr_02);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar3 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlagsData",
                 (ulong)(uint)(iVar5 - iVar3));
          local_44 = local_44 + 1;
          printf(" %d",(ulong)uVar8);
          printf(" %d",(ulong)uVar11);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar10;
        }
        pxVar10 = (xmlNodePtr)(ulong)(iVar4 + 1U);
      } while (iVar4 + 1U != 3);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  function_tests = function_tests + 1;
  uVar8 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    uVar9 = 0xffffffff;
    if (uVar8 < 4) {
      uVar9 = *local_40;
    }
    xmlXIncludeSetFlags(0,uVar9);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeSetFlags",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar8);
      putchar(10);
    }
    uVar8 = uVar8 + 1;
    local_40 = local_40 + 1;
  } while (uVar8 != 4);
  function_tests = function_tests + 1;
  uVar8 = iVar2 + iVar1 + local_34 + local_48 + local_44 + iVar3;
  if (uVar8 != 0) {
    printf("Module xinclude: %d errors\n",(ulong)uVar8);
  }
  return uVar8;
}

Assistant:

static int
test_xinclude(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xinclude : 8 of 10 functions ...\n");
    test_ret += test_xmlXIncludeNewContext();
    test_ret += test_xmlXIncludeProcess();
    test_ret += test_xmlXIncludeProcessFlags();
    test_ret += test_xmlXIncludeProcessFlagsData();
    test_ret += test_xmlXIncludeProcessNode();
    test_ret += test_xmlXIncludeProcessTree();
    test_ret += test_xmlXIncludeProcessTreeFlags();
    test_ret += test_xmlXIncludeProcessTreeFlagsData();
    test_ret += test_xmlXIncludeSetFlags();

    if (test_ret != 0)
	printf("Module xinclude: %d errors\n", test_ret);
    return(test_ret);
}